

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponential_biased.cc
# Opt level: O0

int64_t __thiscall
absl::lts_20250127::profiling_internal::ExponentialBiased::GetSkipCount
          (ExponentialBiased *this,int64_t mean)

{
  uint64_t uVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double value;
  double interval;
  double q;
  uint64_t rng;
  int64_t mean_local;
  ExponentialBiased *this_local;
  
  if (((this->initialized_ ^ 0xffU) & 1) != 0) {
    Initialize(this);
  }
  uVar1 = NextRandom(this->rng_);
  this->rng_ = uVar1;
  dVar5 = this->bias_;
  dVar3 = log2((double)(uVar1 >> 0x16 & 0xffffffff) + 1.0);
  dVar4 = log(2.0);
  dVar5 = (dVar3 - 26.0) * -dVar4 * (double)mean + dVar5;
  lVar2 = std::numeric_limits<long>::max();
  if (dVar5 <= (double)(lVar2 / 2)) {
    dVar3 = rint(dVar5);
    this->bias_ = dVar5 - dVar3;
    this_local = (ExponentialBiased *)(long)dVar3;
  }
  else {
    lVar2 = std::numeric_limits<long>::max();
    this_local = (ExponentialBiased *)(lVar2 / 2);
  }
  return (int64_t)this_local;
}

Assistant:

int64_t ExponentialBiased::GetSkipCount(int64_t mean) {
  if (ABSL_PREDICT_FALSE(!initialized_)) {
    Initialize();
  }

  uint64_t rng = NextRandom(rng_);
  rng_ = rng;

  // Take the top 26 bits as the random number
  // (This plus the 1<<58 sampling bound give a max possible step of
  // 5194297183973780480 bytes.)
  // The uint32_t cast is to prevent a (hard-to-reproduce) NAN
  // under piii debug for some binaries.
  double q = static_cast<uint32_t>(rng >> (kPrngNumBits - 26)) + 1.0;
  // Put the computed p-value through the CDF of a geometric.
  double interval = bias_ + (std::log2(q) - 26) * (-std::log(2.0) * mean);
  // Very large values of interval overflow int64_t. To avoid that, we will
  // cheat and clamp any huge values to (int64_t max)/2. This is a potential
  // source of bias, but the mean would need to be such a large value that it's
  // not likely to come up. For example, with a mean of 1e18, the probability of
  // hitting this condition is about 1/1000. For a mean of 1e17, standard
  // calculators claim that this event won't happen.
  if (interval > static_cast<double>(std::numeric_limits<int64_t>::max() / 2)) {
    // Assume huge values are bias neutral, retain bias for next call.
    return std::numeric_limits<int64_t>::max() / 2;
  }
  double value = std::rint(interval);
  bias_ = interval - value;
  return value;
}